

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog_agc.c
# Opt level: O3

int32_t WebRtcAgc_ProcessAnalog
                  (void *state,int32_t inMicLevel,int32_t *outMicLevel,int16_t vadLogRatio,
                  int16_t echo,uint8_t *saturationWarning)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  short sVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  short sVar16;
  undefined6 in_register_00000082;
  int iVar17;
  bool bVar18;
  int local_50 [2];
  undefined4 local_48;
  int *local_40;
  int *local_38;
  
  local_50[0] = inMicLevel << (*(byte *)((long)state + 0x15c) & 0x1f);
  iVar9 = *(int *)((long)state + 0x144);
  if (iVar9 < local_50[0]) {
    return -1;
  }
  iVar17 = *(int *)((long)state + 0x14c);
  if (local_50[0] < iVar17) {
    return -1;
  }
  if (*(short *)((long)state + 0x122) == 0) {
    *(undefined2 *)((long)state + 0x122) = 1;
    iVar8 = ((*(int *)((long)state + 0x140) - iVar17) * 0x33 >> 9) + iVar17;
    if ((local_50[0] < iVar8) && (*(short *)((long)state + 8) == 1)) {
      local_50[0] = iVar8;
    }
    *(int *)((long)state + 0x13c) = local_50[0];
  }
  iVar8 = *(int *)((long)state + 0x13c);
  iVar12 = local_50[0];
  if (((local_50[0] != iVar9) || (iVar12 = iVar9, iVar5 = iVar8, iVar8 <= iVar9)) &&
     (iVar5 = local_50[0], iVar12 != iVar8)) {
    if (iVar12 < *(int *)((long)state + 0x150)) {
      iVar8 = ((*(int *)((long)state + 0x140) - iVar17) * 0x33 >> 9) + iVar17;
      *(int *)((long)state + 0x13c) = iVar8;
      iVar5 = iVar8;
    }
    else if ((iVar12 != iVar8) && (iVar5 = iVar8, *(int *)((long)state + 0x158) != inMicLevel)) {
      *(int *)((long)state + 0x13c) = iVar12;
      iVar8 = iVar12;
      iVar5 = local_50[0];
    }
  }
  local_50[0] = iVar5;
  local_40 = (int *)((long)state + 0x13c);
  if (*(int *)((long)state + 0x140) < iVar8) {
    *(int *)((long)state + 0x140) = iVar8;
  }
  *(int32_t *)((long)state + 0x158) = inMicLevel;
  lVar10 = 0x31;
  do {
    iVar9 = *(int *)((long)state + lVar10 * 4);
    if (0x36b < iVar9 >> 0x14) {
      *(short *)((long)state + 0x116) = *(short *)((long)state + 0x116) + (short)(iVar9 >> 0x14);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x3b);
  local_48 = (undefined4)CONCAT62(in_register_00000082,echo);
  if (*(short *)((long)state + 0x116) < 0x61a9) {
    *(short *)((long)state + 0x116) =
         (short)((uint)(*(short *)((long)state + 0x116) * 0x7eb8) >> 0xf);
  }
  else {
    *(undefined2 *)((long)state + 0x116) = 0;
    uVar13 = *(uint *)((long)state + 0x6c);
    uVar4 = uVar13 + 7;
    if (-1 < (int)uVar13) {
      uVar4 = uVar13;
    }
    *(uint *)((long)state + 0x6c) = (uVar4 & 0xfffffff8) - ((int)uVar4 >> 3);
    *(int *)((long)state + 0x154) = iVar8;
    local_50[0] = ((uint)((iVar8 - iVar17) * 0x7397) >> 0xf) + iVar17;
    if (iVar8 + -2 <= local_50[0]) {
      local_50[0] = iVar8 + -2;
    }
    *(int *)((long)state + 0x13c) = local_50[0];
    if (local_50[0] < *(int *)((long)state + 0x150)) {
      *saturationWarning = '\x01';
    }
    *(undefined4 *)((long)state + 0x11e) = 0xff9c;
    *(undefined4 *)((long)state + 0x70) = 0;
    *(undefined8 *)((long)state + 0x126) = 0x2080154;
    *(undefined8 *)((long)state + 0x5c) = *(undefined8 *)((long)state + 0x20);
  }
  local_38 = outMicLevel;
  WebRtcAgc_ZeroCtrl((LegacyAgc *)state,local_50,(int32_t *)((long)state + 0xc4));
  uVar1 = *(ushort *)((long)state + 0x18c);
  if ((short)uVar1 < 0x9c4) {
    *(undefined2 *)((long)state + 0x118) = 0x5dc;
    sVar11 = 0x5dc;
  }
  else {
    uVar6 = ((short)(0x1194 - uVar1) >> 1) + 400;
    if (0x1193 < uVar1) {
      uVar6 = 400;
    }
    sVar11 = (short)(*(short *)((long)state + 0x118) * 0x1f + (uint)uVar6 >> 5);
    *(short *)((long)state + 0x118) = sVar11;
  }
  sVar16 = *(short *)((long)state + 0x114);
  lVar10 = 0;
  do {
    iVar9 = *(int *)((long)state + lVar10 * 4 + 0x9c);
    *(int *)((long)state + 100) =
         *(int *)((long)state + 100) +
         (iVar9 - *(int *)((long)state + (long)sVar16 * 4 + 0x74) >> 3);
    *(int *)((long)state + (long)sVar16 * 4 + 0x74) = iVar9;
    sVar16 = sVar16 + 1;
    if (sVar16 == 10) {
      sVar16 = 0;
    }
    iVar9 = (iVar9 - *(int *)((long)state + 0x68) >> 6) + *(int *)((long)state + 0x68);
    *(int *)((long)state + 0x68) = iVar9;
    if (sVar11 < vadLogRatio) {
      sVar7 = *(short *)((long)state + 0x12a);
      if (sVar7 < 0xfa) {
        *(short *)((long)state + 0x12a) = sVar7 + 2;
        if (*(int *)((long)state + 0x70) < iVar9) {
          *(int *)((long)state + 0x70) = iVar9;
        }
      }
      else if (sVar7 == 0xfa) {
        *(undefined2 *)((long)state + 0x12a) = 0xfc;
        *(int *)((long)state + 0x6c) = (*(int *)((long)state + 0x70) >> 3) * 10;
      }
      iVar9 = (*(int *)((long)state + 100) - *(int *)((long)state + 0x6c) >> 10) +
              *(int *)((long)state + 0x6c);
      *(int *)((long)state + 0x6c) = iVar9;
      if (*(int *)((long)state + 0x30) < iVar9) {
        sVar7 = *(short *)((long)state + 0x11e) + 2;
        *(short *)((long)state + 0x11e) = sVar7;
        *(undefined2 *)((long)state + 0x11c) = 0;
        *(undefined2 *)((long)state + 0x120) = 0;
        if (*(short *)((long)state + 0x126) < sVar7) {
          *(undefined2 *)((long)state + 0x11e) = 0;
          *(int *)((long)state + 0x6c) = (iVar9 >> 6) * 0x35;
          iVar9 = *(int *)((long)state + 0x13c);
          iVar17 = *(int *)((long)state + 0x140) * 0xf;
          iVar12 = iVar17 + iVar9;
          iVar17 = iVar9 + iVar17 + 0xf;
          if (-1 < iVar12) {
            iVar17 = iVar12;
          }
          iVar12 = iVar17 >> 4;
          if (iVar17 >> 4 <= *(int *)((long)state + 0x144)) {
            iVar12 = *(int *)((long)state + 0x144);
          }
          *(int *)((long)state + 0x140) = iVar12;
          *(int *)((long)state + 0x154) = iVar9;
          local_50[0] = ((uint)((local_50[0] - *(int *)((long)state + 0x14c)) * 0x799a) >> 0xf) +
                        *(int *)((long)state + 0x14c);
          if (iVar8 <= local_50[0]) {
            local_50[0] = iVar8 + -1;
          }
          *(int *)((long)state + 0x13c) = local_50[0];
          *(undefined2 *)((long)state + 0x12a) = 0;
          *(undefined4 *)((long)state + 0x70) = 0;
        }
      }
      else {
        if (*(int *)((long)state + 0x5c) < iVar9) {
          sVar7 = *(short *)((long)state + 0x11e) + 2;
          *(short *)((long)state + 0x11e) = sVar7;
          *(undefined2 *)((long)state + 0x11c) = 0;
          *(undefined2 *)((long)state + 0x120) = 0;
          if (sVar7 <= *(short *)((long)state + 0x128)) goto LAB_0016d1e7;
          *(undefined2 *)((long)state + 0x11e) = 0;
          iVar17 = iVar9 + 0x3f;
          if (-1 < iVar9) {
            iVar17 = iVar9;
          }
          *(int *)((long)state + 0x6c) = (iVar17 >> 6) * 0x35;
          iVar9 = *(int *)((long)state + 0x13c);
          iVar17 = *(int *)((long)state + 0x140) * 0xf;
          iVar12 = iVar17 + iVar9;
          iVar17 = iVar9 + iVar17 + 0xf;
          if (-1 < iVar12) {
            iVar17 = iVar12;
          }
          iVar12 = iVar17 >> 4;
          if (iVar17 >> 4 <= *(int *)((long)state + 0x144)) {
            iVar12 = *(int *)((long)state + 0x144);
          }
          *(int *)((long)state + 0x140) = iVar12;
          *(int *)((long)state + 0x154) = iVar9;
          local_50[0] = ((uint)((local_50[0] - *(int *)((long)state + 0x14c)) * 0x7b85) >> 0xf) +
                        *(int *)((long)state + 0x14c);
          if (iVar8 <= local_50[0]) {
            local_50[0] = iVar8 + -1;
          }
        }
        else if (iVar9 < *(int *)((long)state + 0x34)) {
          *(undefined4 *)((long)state + 0x11e) = 0;
          sVar7 = (short)*(undefined4 *)((long)state + 0x11c) + 2;
          *(short *)((long)state + 0x11c) = sVar7;
          if (sVar7 <= *(short *)((long)state + 0x126)) goto LAB_0016d1e7;
          *(undefined2 *)((long)state + 0x11c) = 0;
          iVar17 = *(int *)((long)state + 0x14c);
          iVar12 = *(int *)((long)state + 0x148) - iVar17;
          if (iVar12 == 0) {
            uVar14 = 7;
            sVar7 = 0x4000;
          }
          else {
            lVar15 = (long)((local_50[0] - iVar17) * 0x4000) / (long)iVar12;
            sVar7 = (short)lVar15;
            uVar13 = (uint)lVar15;
            if (sVar7 < 0x147c) {
              if (sVar7 < 0xa3e) {
                uVar14 = (ulong)(0x51f < sVar7);
                goto LAB_0016d12d;
              }
              bVar18 = (uVar13 & 0xffff) < 0xf5d;
              lVar15 = 2;
            }
            else {
              uVar13 = uVar13 & 0xffff;
              if (uVar13 < 0x1eb9) {
                bVar18 = uVar13 < 0x199b;
                lVar15 = 4;
              }
              else {
                bVar18 = uVar13 < 0x2f5d;
                lVar15 = 6;
              }
            }
            uVar14 = (lVar15 + 1) - (ulong)bVar18;
          }
LAB_0016d12d:
          sVar2 = kOffset1[uVar14];
          sVar3 = kSlope1[uVar14];
          iVar12 = iVar9 + 0x3f;
          if (-1 < iVar9) {
            iVar12 = iVar9;
          }
          *(int *)((long)state + 0x6c) = (iVar12 >> 6) * 0x43;
          local_50[0] = ((uint)((local_50[0] - iVar17) *
                               (int)(short)(sVar2 - (short)((uint)((int)sVar7 * (int)sVar3) >> 0xd))
                               ) >> 0xe) + iVar17;
          if (local_50[0] <= iVar8 + 2) {
            local_50[0] = iVar8 + 2;
          }
        }
        else {
          if (*(int *)((long)state + 0x60) <= iVar9) {
            if (*(short *)((long)state + 0x120) < 0xfa1) {
              *(short *)((long)state + 0x120) = *(short *)((long)state + 0x120) + 2;
            }
            else {
              *(undefined4 *)((long)state + 0x126) = 0x3e801f4;
              *(undefined8 *)((long)state + 0x5c) = *(undefined8 *)((long)state + 0x28);
            }
            *(undefined4 *)((long)state + 0x11c) = 0;
            goto LAB_0016d1e0;
          }
          *(undefined4 *)((long)state + 0x11e) = 0;
          sVar7 = (short)*(undefined4 *)((long)state + 0x11c) + 2;
          *(short *)((long)state + 0x11c) = sVar7;
          if (sVar7 <= *(short *)((long)state + 0x128)) goto LAB_0016d1e7;
          *(undefined2 *)((long)state + 0x11c) = 0;
          iVar17 = *(int *)((long)state + 0x14c);
          iVar12 = *(int *)((long)state + 0x148) - iVar17;
          if (iVar12 == 0) {
            uVar14 = 7;
            sVar7 = 0x4000;
          }
          else {
            lVar15 = (long)((local_50[0] - iVar17) * 0x4000) / (long)iVar12;
            sVar7 = (short)lVar15;
            uVar13 = (uint)lVar15;
            if (sVar7 < 0x147c) {
              if (sVar7 < 0xa3e) {
                uVar14 = (ulong)(0x51f < sVar7);
                goto LAB_0016d196;
              }
              bVar18 = (uVar13 & 0xffff) < 0xf5d;
              lVar15 = 2;
            }
            else {
              uVar13 = uVar13 & 0xffff;
              if (uVar13 < 0x1eb9) {
                bVar18 = uVar13 < 0x199b;
                lVar15 = 4;
              }
              else {
                bVar18 = uVar13 < 0x2f5d;
                lVar15 = 6;
              }
            }
            uVar14 = (lVar15 + 1) - (ulong)bVar18;
          }
LAB_0016d196:
          sVar2 = kOffset2[uVar14];
          sVar3 = kSlope2[uVar14];
          iVar12 = iVar9 + 0x3f;
          if (-1 < iVar9) {
            iVar12 = iVar9;
          }
          *(int *)((long)state + 0x6c) = (iVar12 >> 6) * 0x43;
          local_50[0] = ((uint)((local_50[0] - iVar17) *
                               (int)(short)(sVar2 - (short)((uint)((int)sVar7 * (int)sVar3) >> 0xd))
                               ) >> 0xe) + iVar17;
          if (local_50[0] <= iVar8) {
            local_50[0] = iVar8 + 1;
          }
        }
LAB_0016d1e0:
        *(int *)((long)state + 0x13c) = local_50[0];
      }
    }
LAB_0016d1e7:
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  *(short *)((long)state + 0x114) = sVar16;
  if ((short)local_48 == 1) {
    iVar9 = *local_40;
  }
  else {
    iVar9 = *(int *)((long)state + 0x13c);
    if (0x1f3e < (*(int *)((long)state + 300) - 1U & 0xffff)) goto LAB_0016d242;
  }
  if (iVar8 < iVar9) {
    *local_40 = iVar8;
    iVar9 = iVar8;
  }
LAB_0016d242:
  iVar17 = *(int *)((long)state + 0x140);
  if ((*(int *)((long)state + 0x140) < iVar9) ||
     (iVar17 = *(int *)((long)state + 0x150), iVar9 < *(int *)((long)state + 0x150))) {
    iVar9 = iVar17;
    *local_40 = iVar9;
  }
  iVar17 = *(int *)((long)state + 0x144);
  if (iVar9 < *(int *)((long)state + 0x144)) {
    iVar17 = iVar9;
  }
  *local_38 = iVar17 >> (*(byte *)((long)state + 0x15c) & 0x1f);
  return 0;
}

Assistant:

int32_t WebRtcAgc_ProcessAnalog(void *state, int32_t inMicLevel,
                                int32_t *outMicLevel,
                                int16_t vadLogRatio,
                                int16_t echo, uint8_t *saturationWarning)
{
    uint32_t tmpU32;
    int32_t Rxx16w32, tmp32;
    int32_t inMicLevelTmp, lastMicVol;
    int16_t i;
    uint8_t saturated = 0;
    LegacyAgc* stt;

    stt = (LegacyAgc*)state;
    inMicLevelTmp = inMicLevel << stt->scale;

    if (inMicLevelTmp > stt->maxAnalog)
    {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt,
                "\tAGC->ProcessAnalog, frame %d: micLvl > maxAnalog\n",
                stt->fcount);
#endif
        return -1;
    } else if (inMicLevelTmp < stt->minLevel)
    {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt,
                "\tAGC->ProcessAnalog, frame %d: micLvl < minLevel\n",
                stt->fcount);
#endif
        return -1;
    }

    if (stt->firstCall == 0)
    {
        int32_t tmpVol;
        stt->firstCall = 1;
        tmp32 = ((stt->maxLevel - stt->minLevel) * 51) >> 9;
        tmpVol = (stt->minLevel + tmp32);

        /* If the mic level is very low at start, increase it! */
        if ((inMicLevelTmp < tmpVol) && (stt->agcMode == kAgcModeAdaptiveAnalog))
        {
            inMicLevelTmp = tmpVol;
        }
        stt->micVol = inMicLevelTmp;
    }

    /* Set the mic level to the previous output value if there is digital input gain */
    if ((inMicLevelTmp == stt->maxAnalog) && (stt->micVol > stt->maxAnalog))
    {
        inMicLevelTmp = stt->micVol;
    }

    /* If the mic level was manually changed to a very low value raise it! */
    if ((inMicLevelTmp != stt->micVol) && (inMicLevelTmp < stt->minOutput))
    {
        tmp32 = ((stt->maxLevel - stt->minLevel) * 51) >> 9;
        inMicLevelTmp = (stt->minLevel + tmp32);
        stt->micVol = inMicLevelTmp;
#ifdef MIC_LEVEL_FEEDBACK
        //stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt,
                "\tAGC->ProcessAnalog, frame %d: micLvl < minLevel by manual"
                " decrease, raise vol\n",
                stt->fcount);
#endif
    }

    if (inMicLevelTmp != stt->micVol)
    {
        if (inMicLevel == stt->lastInMicLevel) {
            // We requested a volume adjustment, but it didn't occur. This is
            // probably due to a coarse quantization of the volume slider.
            // Restore the requested value to prevent getting stuck.
            inMicLevelTmp = stt->micVol;
        }
        else {
            // As long as the value changed, update to match.
            stt->micVol = inMicLevelTmp;
        }
    }

    if (inMicLevelTmp > stt->maxLevel)
    {
        // Always allow the user to raise the volume above the maxLevel.
        stt->maxLevel = inMicLevelTmp;
    }

    // Store last value here, after we've taken care of manual updates etc.
    stt->lastInMicLevel = inMicLevel;
    lastMicVol = stt->micVol;

    /* Checks if the signal is saturated. Also a check if individual samples
     * are larger than 12000 is done. If they are the counter for increasing
     * the volume level is set to -100ms
     */
    WebRtcAgc_SaturationCtrl(stt, &saturated, stt->env[0]);

    /* The AGC is always allowed to lower the level if the signal is saturated */
    if (saturated == 1)
    {
        /* Lower the recording level
         * Rxx160_LP is adjusted down because it is so slow it could
         * cause the AGC to make wrong decisions. */
        /* stt->Rxx160_LPw32 *= 0.875; */
        stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 8) * 7;

        stt->zeroCtrlMax = stt->micVol;

        /* stt->micVol *= 0.903; */
        tmp32 = inMicLevelTmp - stt->minLevel;
        tmpU32 = WEBRTC_SPL_UMUL(29591, (uint32_t)(tmp32));
        stt->micVol = (tmpU32 >> 15) + stt->minLevel;
        if (stt->micVol > lastMicVol - 2)
        {
            stt->micVol = lastMicVol - 2;
        }
        inMicLevelTmp = stt->micVol;

#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt,
                "\tAGC->ProcessAnalog, frame %d: saturated, micVol = %d\n",
                stt->fcount,
                stt->micVol);
#endif

        if (stt->micVol < stt->minOutput)
        {
            *saturationWarning = 1;
        }

        /* Reset counter for decrease of volume level to avoid
         * decreasing too much. The saturation control can still
         * lower the level if needed. */
        stt->msTooHigh = -100;

        /* Enable the control mechanism to ensure that our measure,
         * Rxx160_LP, is in the correct range. This must be done since
         * the measure is very slow. */
        stt->activeSpeech = 0;
        stt->Rxx16_LPw32Max = 0;

        /* Reset to initial values */
        stt->msecSpeechInnerChange = kMsecSpeechInner;
        stt->msecSpeechOuterChange = kMsecSpeechOuter;
        stt->changeToSlowMode = 0;

        stt->muteGuardMs = 0;

        stt->upperLimit = stt->startUpperLimit;
        stt->lowerLimit = stt->startLowerLimit;
#ifdef MIC_LEVEL_FEEDBACK
        //stt->numBlocksMicLvlSat = 0;
#endif
    }

    /* Check if the input speech is zero. If so the mic volume
     * is increased. On some computers the input is zero up as high
     * level as 17% */
    WebRtcAgc_ZeroCtrl(stt, &inMicLevelTmp, stt->env[0]);

    /* Check if the near end speaker is inactive.
     * If that is the case the VAD threshold is
     * increased since the VAD speech model gets
     * more sensitive to any sound after a long
     * silence.
     */
    WebRtcAgc_SpeakerInactiveCtrl(stt);

    for (i = 0; i < 5; i++)
    {
        /* Computed on blocks of 16 samples */

        Rxx16w32 = stt->Rxx16w32_array[0][i];

        /* Rxx160w32 in Q(-7) */
        tmp32 = (Rxx16w32 - stt->Rxx16_vectorw32[stt->Rxx16pos]) >> 3;
        stt->Rxx160w32 = stt->Rxx160w32 + tmp32;
        stt->Rxx16_vectorw32[stt->Rxx16pos] = Rxx16w32;

        /* Circular buffer */
        stt->Rxx16pos++;
        if (stt->Rxx16pos == RXX_BUFFER_LEN)
        {
            stt->Rxx16pos = 0;
        }

        /* Rxx16_LPw32 in Q(-4) */
        tmp32 = (Rxx16w32 - stt->Rxx16_LPw32) >> kAlphaShortTerm;
        stt->Rxx16_LPw32 = (stt->Rxx16_LPw32) + tmp32;

        if (vadLogRatio > stt->vadThreshold)
        {
            /* Speech detected! */

            /* Check if Rxx160_LP is in the correct range. If
             * it is too high/low then we set it to the maximum of
             * Rxx16_LPw32 during the first 200ms of speech.
             */
            if (stt->activeSpeech < 250)
            {
                stt->activeSpeech += 2;

                if (stt->Rxx16_LPw32 > stt->Rxx16_LPw32Max)
                {
                    stt->Rxx16_LPw32Max = stt->Rxx16_LPw32;
                }
            } else if (stt->activeSpeech == 250)
            {
                stt->activeSpeech += 2;
                tmp32 = stt->Rxx16_LPw32Max >> 3;
                stt->Rxx160_LPw32 = tmp32 * RXX_BUFFER_LEN;
            }

            tmp32 = (stt->Rxx160w32 - stt->Rxx160_LPw32) >> kAlphaLongTerm;
            stt->Rxx160_LPw32 = stt->Rxx160_LPw32 + tmp32;

            if (stt->Rxx160_LPw32 > stt->upperSecondaryLimit)
            {
                stt->msTooHigh += 2;
                stt->msTooLow = 0;
                stt->changeToSlowMode = 0;

                if (stt->msTooHigh > stt->msecSpeechOuterChange)
                {
                    stt->msTooHigh = 0;

                    /* Lower the recording level */
                    /* Multiply by 0.828125 which corresponds to decreasing ~0.8dB */
                    tmp32 = stt->Rxx160_LPw32 >> 6;
                    stt->Rxx160_LPw32 = tmp32 * 53;

                    /* Reduce the max gain to avoid excessive oscillation
                     * (but never drop below the maximum analog level).
                     */
                    stt->maxLevel = (15 * stt->maxLevel + stt->micVol) / 16;
                    stt->maxLevel = WEBRTC_SPL_MAX(stt->maxLevel, stt->maxAnalog);

                    stt->zeroCtrlMax = stt->micVol;

                    /* 0.95 in Q15 */
                    tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = WEBRTC_SPL_UMUL(31130, (uint32_t)(tmp32));
                    stt->micVol = (tmpU32 >> 15) + stt->minLevel;
                    if (stt->micVol > lastMicVol - 1)
                    {
                        stt->micVol = lastMicVol - 1;
                    }
                    inMicLevelTmp = stt->micVol;

                    /* Enable the control mechanism to ensure that our measure,
                     * Rxx160_LP, is in the correct range.
                     */
                    stt->activeSpeech = 0;
                    stt->Rxx16_LPw32Max = 0;
#ifdef MIC_LEVEL_FEEDBACK
                    //stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure >"
                            " 2ndUpperLim, micVol = %d, maxLevel = %d\n",
                            stt->fcount,
                            stt->micVol,
                            stt->maxLevel);
#endif
                }
            } else if (stt->Rxx160_LPw32 > stt->upperLimit)
            {
                stt->msTooHigh += 2;
                stt->msTooLow = 0;
                stt->changeToSlowMode = 0;

                if (stt->msTooHigh > stt->msecSpeechInnerChange)
                {
                    /* Lower the recording level */
                    stt->msTooHigh = 0;
                    /* Multiply by 0.828125 which corresponds to decreasing ~0.8dB */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 53;

                    /* Reduce the max gain to avoid excessive oscillation
                     * (but never drop below the maximum analog level).
                     */
                    stt->maxLevel = (15 * stt->maxLevel + stt->micVol) / 16;
                    stt->maxLevel = WEBRTC_SPL_MAX(stt->maxLevel, stt->maxAnalog);

                    stt->zeroCtrlMax = stt->micVol;

                    /* 0.965 in Q15 */
                    tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = WEBRTC_SPL_UMUL(31621, (uint32_t)(inMicLevelTmp - stt->minLevel));
                    stt->micVol = (tmpU32 >> 15) + stt->minLevel;
                    if (stt->micVol > lastMicVol - 1)
                    {
                        stt->micVol = lastMicVol - 1;
                    }
                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    //stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure >"
                            " UpperLim, micVol = %d, maxLevel = %d\n",
                            stt->fcount,
                            stt->micVol,
                            stt->maxLevel);
#endif
                }
            } else if (stt->Rxx160_LPw32 < stt->lowerSecondaryLimit)
            {
                stt->msTooHigh = 0;
                stt->changeToSlowMode = 0;
                stt->msTooLow += 2;

                if (stt->msTooLow > stt->msecSpeechOuterChange)
                {
                    /* Raise the recording level */
                    int16_t index, weightFIX;
                    int16_t volNormFIX = 16384; // =1 in Q14.

                    stt->msTooLow = 0;

                    /* Normalize the volume level */
                    tmp32 = (inMicLevelTmp - stt->minLevel) << 14;
                    if (stt->maxInit != stt->minLevel)
                    {
                        volNormFIX = tmp32 / (stt->maxInit - stt->minLevel);
                    }

                    /* Find correct curve */
                    WebRtcAgc_ExpCurve(volNormFIX, &index);

                    /* Compute weighting factor for the volume increase, 32^(-2*X)/2+1.05 */
                    weightFIX = kOffset1[index] -
                        (int16_t)((kSlope1[index] * volNormFIX) >> 13);

                    /* stt->Rxx160_LPw32 *= 1.047 [~0.2 dB]; */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 67;

                    tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t)weightFIX * (uint32_t)(inMicLevelTmp - stt->minLevel));
                    stt->micVol = (tmpU32 >> 14) + stt->minLevel;
                    if (stt->micVol < lastMicVol + 2)
                    {
                        stt->micVol = lastMicVol + 2;
                    }

                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    /* Count ms in level saturation */
                    //if (stt->micVol > stt->maxAnalog) {
                    if (stt->micVol > 150)
                    {
                        /* mic level is saturated */
                        stt->numBlocksMicLvlSat++;
                        fprintf(stderr, "Sat mic Level: %d\n", stt->numBlocksMicLvlSat);
                    }
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure <"
                            " 2ndLowerLim, micVol = %d\n",
                            stt->fcount,
                            stt->micVol);
#endif
                }
            } else if (stt->Rxx160_LPw32 < stt->lowerLimit)
            {
                stt->msTooHigh = 0;
                stt->changeToSlowMode = 0;
                stt->msTooLow += 2;

                if (stt->msTooLow > stt->msecSpeechInnerChange)
                {
                    /* Raise the recording level */
                    int16_t index, weightFIX;
                    int16_t volNormFIX = 16384; // =1 in Q14.

                    stt->msTooLow = 0;

                    /* Normalize the volume level */
                    tmp32 = (inMicLevelTmp - stt->minLevel) << 14;
                    if (stt->maxInit != stt->minLevel)
                    {
                        volNormFIX = tmp32 / (stt->maxInit - stt->minLevel);
                    }

                    /* Find correct curve */
                    WebRtcAgc_ExpCurve(volNormFIX, &index);

                    /* Compute weighting factor for the volume increase, (3.^(-2.*X))/8+1 */
                    weightFIX = kOffset2[index] -
                        (int16_t)((kSlope2[index] * volNormFIX) >> 13);

                    /* stt->Rxx160_LPw32 *= 1.047 [~0.2 dB]; */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 67;

                    tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t)weightFIX * (uint32_t)(inMicLevelTmp - stt->minLevel));
                    stt->micVol = (tmpU32 >> 14) + stt->minLevel;
                    if (stt->micVol < lastMicVol + 1)
                    {
                        stt->micVol = lastMicVol + 1;
                    }

                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    /* Count ms in level saturation */
                    //if (stt->micVol > stt->maxAnalog) {
                    if (stt->micVol > 150)
                    {
                        /* mic level is saturated */
                        stt->numBlocksMicLvlSat++;
                        fprintf(stderr, "Sat mic Level: %d\n", stt->numBlocksMicLvlSat);
                    }
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure < LowerLim, micVol = %d\n",
                            stt->fcount,
                            stt->micVol);
#endif

                }
            } else
            {
                /* The signal is inside the desired range which is:
                 * lowerLimit < Rxx160_LP/640 < upperLimit
                 */
                if (stt->changeToSlowMode > 4000)
                {
                    stt->msecSpeechInnerChange = 1000;
                    stt->msecSpeechOuterChange = 500;
                    stt->upperLimit = stt->upperPrimaryLimit;
                    stt->lowerLimit = stt->lowerPrimaryLimit;
                } else
                {
                    stt->changeToSlowMode += 2; // in milliseconds
                }
                stt->msTooLow = 0;
                stt->msTooHigh = 0;

                stt->micVol = inMicLevelTmp;

            }
#ifdef MIC_LEVEL_FEEDBACK
            if (stt->numBlocksMicLvlSat > NUM_BLOCKS_IN_SAT_BEFORE_CHANGE_TARGET)
            {
                stt->micLvlSat = 1;
                fprintf(stderr, "target before = %d (%d)\n", stt->analogTargetLevel, stt->targetIdx);
                WebRtcAgc_UpdateAgcThresholds(stt);
                WebRtcAgc_CalculateGainTable(&(stt->digitalAgc.gainTable[0]),
                        stt->compressionGaindB, stt->targetLevelDbfs, stt->limiterEnable,
                        stt->analogTarget);
                stt->numBlocksMicLvlSat = 0;
                stt->micLvlSat = 0;
                fprintf(stderr, "target offset = %d\n", stt->targetIdxOffset);
                fprintf(stderr, "target after  = %d (%d)\n", stt->analogTargetLevel, stt->targetIdx);
            }
#endif
        }
    }

    /* Ensure gain is not increased in presence of echo or after a mute event
     * (but allow the zeroCtrl() increase on the frame of a mute detection).
     */
    if (echo == 1 || (stt->muteGuardMs > 0 && stt->muteGuardMs < kMuteGuardTimeMs))
    {
        if (stt->micVol > lastMicVol)
        {
            stt->micVol = lastMicVol;
        }
    }

    /* limit the gain */
    if (stt->micVol > stt->maxLevel)
    {
        stt->micVol = stt->maxLevel;
    } else if (stt->micVol < stt->minOutput)
    {
        stt->micVol = stt->minOutput;
    }

    *outMicLevel = WEBRTC_SPL_MIN(stt->micVol, stt->maxAnalog) >> stt->scale;

    return 0;
}